

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_schema_entry.cpp
# Opt level: O2

void __thiscall
duckdb::DuckSchemaEntry::DropEntry(DuckSchemaEntry *this,ClientContext *context,DropInfo *info)

{
  string *name;
  CatalogTransaction transaction_00;
  CatalogTransaction transaction_01;
  CatalogTransaction transaction_02;
  optional_ptr<duckdb::DatabaseInstance,_true> oVar1;
  optional_ptr<duckdb::ClientContext,_true> oVar2;
  optional_ptr<duckdb::Transaction,_true> oVar3;
  transaction_t tVar4;
  transaction_t tVar5;
  bool bVar6;
  CatalogSet *this_00;
  CatalogEntry *pCVar7;
  TableCatalogEntry *table;
  reference this_01;
  type pAVar8;
  CatalogException *this_02;
  InternalException *pIVar9;
  CatalogType type;
  CatalogType type_00;
  DuckSchemaEntry *this_03;
  idx_t i;
  ulong __n;
  allocator local_171;
  optional_ptr<duckdb::CatalogEntry,_true> existing_entry;
  vector<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>,_true>
  fk_arrays;
  string local_150;
  CatalogTransaction transaction;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = GetCatalogSet(this,(info->super_ParseInfo).field_0x9);
  SchemaCatalogEntry::GetCatalogTransaction(&transaction,&this->super_SchemaCatalogEntry,context);
  name = &info->name;
  transaction_00.context.ptr._0_4_ = (int)transaction.context.ptr;
  transaction_00.db.ptr = transaction.db.ptr;
  transaction_00.context.ptr._4_4_ = (int)((ulong)transaction.context.ptr >> 0x20);
  transaction_00.transaction.ptr._0_4_ = (int)transaction.transaction.ptr;
  transaction_00.transaction.ptr._4_4_ = (int)((ulong)transaction.transaction.ptr >> 0x20);
  transaction_00.transaction_id._0_4_ = (int)transaction.transaction_id;
  transaction_00.transaction_id._4_4_ = (int)(transaction.transaction_id >> 0x20);
  transaction_00.start_time = transaction.start_time;
  existing_entry = CatalogSet::GetEntry(this_00,transaction_00,name);
  if (existing_entry.ptr == (CatalogEntry *)0x0) {
    pIVar9 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_150,"Failed to drop entry \"%s\" - entry could not be found",
               (allocator *)&fk_arrays);
    ::std::__cxx11::string::string((string *)&local_50,(string *)name);
    InternalException::InternalException<std::__cxx11::string>(pIVar9,&local_150,&local_50);
    __cxa_throw(pIVar9,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pCVar7 = optional_ptr<duckdb::CatalogEntry,_true>::operator->(&existing_entry);
  if (pCVar7->type == (info->super_ParseInfo).field_0x9) {
    fk_arrays.
    super_vector<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    fk_arrays.
    super_vector<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    fk_arrays.
    super_vector<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pCVar7 = optional_ptr<duckdb::CatalogEntry,_true>::operator->(&existing_entry);
    if (pCVar7->type == TABLE_ENTRY) {
      table = (TableCatalogEntry *)
              optional_ptr<duckdb::CatalogEntry,_true>::operator->(&existing_entry);
      FindForeignKeyInformation(table,AFT_DELETE,&fk_arrays);
    }
    tVar5 = transaction.start_time;
    tVar4 = transaction.transaction_id;
    oVar3.ptr = transaction.transaction.ptr;
    oVar2.ptr = transaction.context.ptr;
    oVar1.ptr = transaction.db.ptr;
    this_03 = (DuckSchemaEntry *)&existing_entry;
    pCVar7 = optional_ptr<duckdb::CatalogEntry,_true>::operator*
                       ((optional_ptr<duckdb::CatalogEntry,_true> *)this_03);
    transaction_01.context.ptr._0_4_ = (int)oVar2.ptr;
    transaction_01.db.ptr = oVar1.ptr;
    transaction_01.context.ptr._4_4_ = (int)((ulong)oVar2.ptr >> 0x20);
    transaction_01.transaction.ptr._0_4_ = (int)oVar3.ptr;
    transaction_01.transaction.ptr._4_4_ = (int)((ulong)oVar3.ptr >> 0x20);
    transaction_01.transaction_id._0_4_ = (int)tVar4;
    transaction_01.transaction_id._4_4_ = (int)(tVar4 >> 0x20);
    transaction_01.start_time = tVar5;
    OnDropEntry(this_03,transaction_01,pCVar7);
    transaction_02.context.ptr._0_4_ = (int)transaction.context.ptr;
    transaction_02.db.ptr = transaction.db.ptr;
    transaction_02.context.ptr._4_4_ = (int)((ulong)transaction.context.ptr >> 0x20);
    transaction_02.transaction.ptr._0_4_ = (int)transaction.transaction.ptr;
    transaction_02.transaction.ptr._4_4_ = (int)((ulong)transaction.transaction.ptr >> 0x20);
    transaction_02.transaction_id._0_4_ = (int)transaction.transaction_id;
    transaction_02.transaction_id._4_4_ = (int)(transaction.transaction_id >> 0x20);
    transaction_02.start_time = transaction.start_time;
    bVar6 = CatalogSet::DropEntry
                      (this_00,transaction_02,name,info->cascade,info->allow_drop_internal);
    if (bVar6) {
      for (__n = 0; __n < (ulong)((long)fk_arrays.
                                        super_vector<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>_>_>
                                        .
                                        super__Vector_base<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)fk_arrays.
                                        super_vector<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>_>_>
                                        .
                                        super__Vector_base<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3);
          __n = __n + 1) {
        this_01 = vector<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>,_true>
                  ::get<true>(&fk_arrays,__n);
        pAVar8 = unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>
                 ::operator*(this_01);
        (*(this->super_SchemaCatalogEntry).super_InCatalogEntry.super_CatalogEntry.
          _vptr_CatalogEntry[0x20])(this,pAVar8);
      }
      ::std::
      vector<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>_>_>
      ::~vector(&fk_arrays.
                 super_vector<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>_>_>
               );
      return;
    }
    pIVar9 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_150,"Could not drop element because of an internal error",&local_171
              );
    InternalException::InternalException(pIVar9,&local_150);
    __cxa_throw(pIVar9,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  this_02 = (CatalogException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_150,"Existing object %s is of type %s, trying to drop type %s",
             (allocator *)&fk_arrays);
  ::std::__cxx11::string::string((string *)&local_70,(string *)name);
  pCVar7 = optional_ptr<duckdb::CatalogEntry,_true>::operator->(&existing_entry);
  CatalogTypeToString_abi_cxx11_(&local_90,(duckdb *)(ulong)pCVar7->type,type);
  CatalogTypeToString_abi_cxx11_
            (&local_b0,(duckdb *)(ulong)(byte)(info->super_ParseInfo).field_0x9,type_00);
  CatalogException::CatalogException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (this_02,&local_150,&local_70,&local_90,&local_b0);
  __cxa_throw(this_02,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void DuckSchemaEntry::DropEntry(ClientContext &context, DropInfo &info) {
	auto &set = GetCatalogSet(info.type);

	// first find the entry
	auto transaction = GetCatalogTransaction(context);
	auto existing_entry = set.GetEntry(transaction, info.name);
	if (!existing_entry) {
		throw InternalException("Failed to drop entry \"%s\" - entry could not be found", info.name);
	}
	if (existing_entry->type != info.type) {
		throw CatalogException("Existing object %s is of type %s, trying to drop type %s", info.name,
		                       CatalogTypeToString(existing_entry->type), CatalogTypeToString(info.type));
	}

	vector<unique_ptr<AlterForeignKeyInfo>> fk_arrays;
	if (existing_entry->type == CatalogType::TABLE_ENTRY) {
		// if there is a foreign key constraint, get that information
		auto &table_entry = existing_entry->Cast<TableCatalogEntry>();
		FindForeignKeyInformation(table_entry, AlterForeignKeyType::AFT_DELETE, fk_arrays);
	}

	OnDropEntry(transaction, *existing_entry);
	if (!set.DropEntry(transaction, info.name, info.cascade, info.allow_drop_internal)) {
		throw InternalException("Could not drop element because of an internal error");
	}

	// remove the foreign key constraint in main key table if main key table's name is valid
	for (idx_t i = 0; i < fk_arrays.size(); i++) {
		// alter primary key table
		Alter(transaction, *fk_arrays[i]);
	}
}